

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void rapidjson::
     SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
               (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is)

{
  Ch CVar1;
  bool bVar2;
  Ch c;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *s;
  StreamLocalCopy<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_0>
  copy;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is_local;
  
  copy.s = is;
  internal::
  StreamLocalCopy<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_0>
  ::StreamLocalCopy((StreamLocalCopy<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_0>
                     *)&s,is);
  while( true ) {
    CVar1 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek(s);
    bVar2 = true;
    if (((CVar1 != ' ') && (bVar2 = true, CVar1 != '\n')) && (bVar2 = true, CVar1 != '\r')) {
      bVar2 = CVar1 == '\t';
    }
    if (!bVar2) break;
    EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take(s);
  }
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}